

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:219:7)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:219:7)>
      *this)

{
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> local_40 [3];
  Own<capnp::ResponseHook> local_10;
  
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            (local_40,(this->func).pipelinePromise);
  Own<capnp::ResponseHook>::dispose(&local_10);
  return;
}

Assistant:

void run() override {
    func();
  }